

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ArrayFeatureType::ArrayFeatureType
          (ArrayFeatureType *this,ArrayFeatureType *from)

{
  DefaultOptionalValueUnion DVar1;
  uint32 uVar2;
  int32 iVar3;
  void *pvVar4;
  ArrayFeatureType_ShapeRange *this_00;
  ArrayFeatureType_ShapeRange *from_00;
  ArrayFeatureType_EnumeratedShapes *this_01;
  ArrayFeatureType_EnumeratedShapes *from_01;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ArrayFeatureType_00392e78;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  google::protobuf::RepeatedField<long>::RepeatedField(&this->shape_,&from->shape_);
  this->_cached_size_ = 0;
  pvVar4 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar4 & 0xfffffffffffffffe));
  }
  this->datatype_ = from->datatype_;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 0x15) {
    this_01 = mutable_enumeratedshapes(this);
    from_01 = enumeratedshapes(from);
    ArrayFeatureType_EnumeratedShapes::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 0x1f) {
    this_00 = mutable_shaperange(this);
    from_00 = shaperange(from);
    ArrayFeatureType_ShapeRange::MergeFrom(this_00,from_00);
  }
  this->_oneof_case_[1] = 0;
  uVar2 = from->_oneof_case_[1];
  if (uVar2 == 0x3d) {
    DVar1 = from->defaultOptionalValue_;
    this->_oneof_case_[1] = 0x3d;
    this->defaultOptionalValue_ = DVar1;
  }
  else if (uVar2 == 0x33) {
    iVar3 = (from->defaultOptionalValue_).intdefaultvalue_;
    this->_oneof_case_[1] = 0x33;
    (this->defaultOptionalValue_).intdefaultvalue_ = iVar3;
  }
  else if (uVar2 == 0x29) {
    iVar3 = (from->defaultOptionalValue_).intdefaultvalue_;
    this->_oneof_case_[1] = 0x29;
    (this->defaultOptionalValue_).intdefaultvalue_ = iVar3;
  }
  return;
}

Assistant:

ArrayFeatureType::ArrayFeatureType(const ArrayFeatureType& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      shape_(from.shape_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  datatype_ = from.datatype_;
  clear_has_ShapeFlexibility();
  switch (from.ShapeFlexibility_case()) {
    case kEnumeratedShapes: {
      mutable_enumeratedshapes()->::CoreML::Specification::ArrayFeatureType_EnumeratedShapes::MergeFrom(from.enumeratedshapes());
      break;
    }
    case kShapeRange: {
      mutable_shaperange()->::CoreML::Specification::ArrayFeatureType_ShapeRange::MergeFrom(from.shaperange());
      break;
    }
    case SHAPEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  clear_has_defaultOptionalValue();
  switch (from.defaultOptionalValue_case()) {
    case kIntDefaultValue: {
      set_intdefaultvalue(from.intdefaultvalue());
      break;
    }
    case kFloatDefaultValue: {
      set_floatdefaultvalue(from.floatdefaultvalue());
      break;
    }
    case kDoubleDefaultValue: {
      set_doubledefaultvalue(from.doubledefaultvalue());
      break;
    }
    case DEFAULTOPTIONALVALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ArrayFeatureType)
}